

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

int emit_C__decl(LinearizerState *linearizer,Ravi_CompilerInterface *api,TextBuffer *mb)

{
  C_Token *tok_00;
  C_Obj *pCVar1;
  int iVar2;
  C_Parser *parser_00;
  char *str;
  C_Token *tok;
  C_Decl_Analysis analysis;
  C_Scope *global_scope;
  C_Parser parser;
  C_MemoryAllocator allocator;
  TextBuffer code;
  TextBuffer *mb_local;
  Ravi_CompilerInterface *api_local;
  LinearizerState *linearizer_local;
  
  if (((linearizer->C_declarations).buf == (char *)0x0) ||
     (*(linearizer->C_declarations).buf == '\0')) {
    linearizer_local._4_4_ = 0;
  }
  else {
    raviX_buffer_init((TextBuffer *)&allocator.destroy_arena,0x400);
    raviX_buffer_add_string
              ((TextBuffer *)&allocator.destroy_arena,
               "typedef long long int64_t;\ntypedef double lua_Number;\ntypedef int64_t lua_Integer;\ntypedef struct {\n   union { lua_Integer i; lua_Number n; } value_;\n} TValue;\nstatic lua_Integer ivalue(const TValue *v) { return 0; }\nstatic void setivalue(TValue *v, lua_Integer i) {}\nstatic lua_Number  fvalue(const TValue *v) { return 0.0; }\nstatic void setfltvalue(TValue *v, lua_Number f) {}\ntypedef struct {\n   char *data;\n   unsigned int len;\n} Ravi_Arr;\nstatic Ravi_Arr *arrvalue(const TValue *v) { return (Ravi_Arr *)v; }\nstatic int ttisfulluserdata(const TValue *v) { return 0; }\nstatic int ttislightuserdata(const TValue *v) { return 0; }\nstatic int ttisstring(const TValue *v) { return 0; }\nstatic void *uvalue(const TValue *v) { return (void*)0; }\nstatic void *pvalue(const TValue *v) { return (void*)0; }\nstatic void *svalue(const TValue *v) { return (void*)0; }\nstatic void *getudatamem(const TValue *v) { return (void*)0; }\nstatic void *gco2u(const TValue *v) { return (void*)0; }\nstatic unsigned int sizeudata(const void *p) { return 0; }\nstatic unsigned int vslen(const TValue *v) { return 0; }\nstatic void settt_(TValue *v, int tt) {}\nTValue *R(int reg) { return (void*)0; }\nstatic const int LUA_TNIL = 0;\nstatic const int LUA_TBOOLEAN = 1;\nstatic const int LUA_TLIGHTUSERDATA = 2;\nstatic const int LUA_TNUMBER = 3;\nstatic const int LUA_TSTRING = 4;\nstatic const int LUA_TTABLE = 5;\nstatic const int LUA_TFUNCTION = 6;\nstatic const int LUA_TUSERDATA = 7;\nstatic const int LUA_TTHREAD = 8;\ntypedef struct {\n   char *ptr;\n   unsigned int len;\n} Ravi_StringOrUserData;\ntypedef struct {\n  lua_Integer *ptr;\n  unsigned int len;\n} Ravi_IntegerArray;\ntypedef struct {\n  lua_Number *ptr;\n  unsigned int len;\n} Ravi_NumberArray;\nint raviX__error_code;\n"
              );
    raviX_buffer_add_string((TextBuffer *)&allocator.destroy_arena,(linearizer->C_declarations).buf)
    ;
    memcpy(&parser.embedded_mode,linearizer->compiler_state->allocator,0x30);
    parser._376_8_ = (*allocator.free)((void *)0x0,(void *)0x0);
    C_parser_init((C_Parser *)&global_scope,(C_MemoryAllocator *)&parser.embedded_mode);
    analysis.parser = (C_Parser *)C_global_scope((C_Parser *)&global_scope);
    tok = (C_Token *)&global_scope;
    analysis.global_scope._0_4_ = 0;
    analysis.global_scope._4_4_ = 0;
    analysis._16_8_ = api;
    analysis.api = (Ravi_CompilerInterface *)analysis.parser;
    tok_00 = C_tokenize_buffer((C_Parser *)&global_scope,(char *)allocator.destroy_arena);
    iVar2 = (int)allocator.destroy_arena;
    if (tok_00 == (C_Token *)0x0) {
      analysis.global_scope._0_4_ = -1;
    }
    else {
      C_convert_pp_tokens((C_Parser *)&global_scope,tok_00);
      parser_00 = (C_Parser *)&global_scope;
      pCVar1 = C_parse((C_Scope *)analysis.api,parser_00,tok_00);
      iVar2 = (int)parser_00;
      if (pCVar1 == (C_Obj *)0x0) {
        analysis.global_scope._0_4_ = -1;
      }
      else {
        analysis.global_scope._4_4_ = 1;
        hashmap_foreach((HashMap *)&(analysis.api)->compiler_options,analyze_C_declarations,&tok);
        analysis.global_scope._4_4_ = 0;
        iVar2 = 0x12b510;
        hashmap_foreach((HashMap *)&(analysis.api)->source,analyze_C_declarations,&tok);
        if ((int)analysis.global_scope == 0) {
          str = (linearizer->C_declarations).buf;
          raviX_buffer_add_string(mb,str);
          iVar2 = (int)str;
        }
      }
    }
    if (((int)analysis.global_scope < 0) && (parser.env[0].__saved_mask.__val[0xf] != 0)) {
      (*api->error_message)(api->context,(char *)parser.env[0].__saved_mask.__val[0xf]);
      iVar2 = (int)parser.env[0].__saved_mask.__val[0xf];
    }
    C_parser_destroy((C_Parser *)&global_scope);
    (*allocator.create_arena)(parser._376_8_,iVar2);
    raviX_buffer_free((TextBuffer *)&allocator.destroy_arena);
    linearizer_local._4_4_ = (int)analysis.global_scope;
  }
  return linearizer_local._4_4_;
}

Assistant:

static int emit_C__decl(LinearizerState *linearizer, struct Ravi_CompilerInterface *api, TextBuffer *mb)
{
	if (linearizer->C_declarations.buf == NULL || linearizer->C_declarations.buf[0] == 0)
		return 0;

	TextBuffer code;
	raviX_buffer_init(&code, 1024);
	raviX_buffer_add_string(&code, Embedded_C_header);
	raviX_buffer_add_string(&code, linearizer->C_declarations.buf);

	C_MemoryAllocator allocator = *linearizer->compiler_state->allocator;
	allocator.arena = allocator.create_arena(0, 0);

	C_Parser parser;
	C_parser_init(&parser, &allocator);
	C_Scope *global_scope = C_global_scope(&parser);
	C_Decl_Analysis analysis = {&parser, global_scope, 0, 0, api};

	C_Token *tok = C_tokenize_buffer(&parser, code.buf);
	if (tok == NULL) {
		analysis.status = -1;
		goto Lexit;
	}
	C_convert_pp_tokens(&parser, tok);
	if (C_parse(global_scope, &parser, tok) == NULL) {
		analysis.status = -1;
		goto Lexit;
	}

	// analyze declarations - do not allow pointers or unions in structs
	// or global object declarations
	analysis.is_tags = 1;
	hashmap_foreach(&global_scope->tags, analyze_C_declarations, &analysis);
	analysis.is_tags = 0;
	hashmap_foreach(&global_scope->vars, analyze_C_declarations, &analysis);

	if (analysis.status == 0) {
		raviX_buffer_add_string(mb, linearizer->C_declarations.buf);
	}

Lexit:
	if (analysis.status < 0 && parser.error_message) {
		api->error_message(api->context, parser.error_message);
	}
	C_parser_destroy(&parser);
	allocator.destroy_arena(allocator.arena);
	raviX_buffer_free(&code);

	return analysis.status;
}